

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool __thiscall
MeCab::EncoderFeatureIndex::save(EncoderFeatureIndex *this,char *filename,char *header)

{
  uint uVar1;
  long lVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  ofstream ofs;
  undefined8 auStack_228 [2];
  uint auStack_218 [122];
  
  if (header == (char *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x29d);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"header");
    std::operator<<(poVar3,"] ");
    die::~die((die *)&ofs);
  }
  if ((this->super_FeatureIndex).alpha_ == (double *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x29e);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"alpha_");
    std::operator<<(poVar3,"] ");
    die::~die((die *)&ofs);
  }
  std::ofstream::ofstream(&ofs,filename,_S_out);
  lVar2 = *(long *)(_ofs + -0x18);
  uVar1 = *(uint *)((long)auStack_218 + lVar2 + 8);
  if ((uVar1 & 5) == 0) {
    *(uint *)((long)auStack_218 + lVar2) = *(uint *)((long)auStack_218 + lVar2) & 0xfffffefb | 4;
    *(undefined8 *)((long)auStack_228 + *(long *)(_ofs + -0x18)) = 0x10;
    std::operator<<((ostream *)&ofs,header);
    std::endl<char,std::char_traits<char>>((ostream *)&ofs);
    for (p_Var4 = (this->dic_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->dic_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      poVar3 = std::ostream::_M_insert<double>
                         ((this->super_FeatureIndex).alpha_[(int)p_Var4[2]._M_color]);
      poVar3 = std::operator<<(poVar3,'\t');
      poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 1));
      std::operator<<(poVar3,'\n');
    }
  }
  std::ofstream::~ofstream(&ofs);
  return (uVar1 & 5) == 0;
}

Assistant:

bool EncoderFeatureIndex::save(const char *filename, const char *header) const {
  CHECK_DIE(header);
  CHECK_DIE(alpha_);

  std::ofstream ofs(WPATH(filename));
  if (!ofs) {
    return false;
  }

  ofs.setf(std::ios::fixed, std::ios::floatfield);
  ofs.precision(16);

  ofs << header;
  ofs << std::endl;

  for (std::map<std::string, int>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    ofs << alpha_[it->second] << '\t' << it->first << '\n';
  }

  return true;
}